

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  FeatureSet *from;
  OneofOptions *this_00;
  OneofOptions *pOVar3;
  FeatureSet *this_01;
  Arena *pAVar4;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar2 + ~value._M_len);
  pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar4);
  pOVar3 = this->options_;
  if (pOVar3 != (OneofOptions *)_OneofOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (OneofOptions *)0x0) {
      pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      this_00 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar4);
      (proto->field_0)._impl_.options_ = this_00;
    }
    OneofOptions::CopyFrom(this_00,pOVar3);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pOVar3 = (proto->field_0)._impl_.options_;
    if (pOVar3 == (OneofOptions *)0x0) {
      pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      pOVar3 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar4);
      (proto->field_0)._impl_.options_ = pOVar3;
    }
    pbVar1 = (byte *)((long)&pOVar3->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pOVar3->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar4 = (Arena *)(pOVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar4);
      (pOVar3->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}